

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
LLVMBC::GetElementPtrInst::GetElementPtrInst
          (GetElementPtrInst *this,Type *pointer_type,Vector<Value_*> *indices,bool inbounds_)

{
  _Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_38;
  
  Instruction::Instruction(&this->super_Instruction,pointer_type,GetElementPtr);
  this->inbounds = inbounds_;
  local_38._M_impl.super__Vector_impl_data._M_start =
       (indices->
       super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_38._M_impl.super__Vector_impl_data._M_finish =
       (indices->
       super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
       (indices->
       super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (indices->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (indices->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (indices->super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::_M_move_assign
            (&(this->super_Instruction).operands,&local_38);
  std::_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
  ~_Vector_base(&local_38);
  return;
}

Assistant:

GetElementPtrInst::GetElementPtrInst(Type *pointer_type, Vector<Value *> indices, bool inbounds_)
    : Instruction(pointer_type, ValueKind::GetElementPtr)
    , inbounds(inbounds_)
{
	set_operands(std::move(indices));
}